

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

JoinerInfo * __thiscall
ot::commissioner::CommissionerApp::GetJoinerInfo
          (CommissionerApp *this,JoinerType aType,ByteArray *aJoinerId)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_98;
  key_type local_90;
  _Base_ptr local_70;
  _Self local_68 [3];
  key_type local_50;
  _Self local_30;
  iterator joinerInfo;
  ByteArray *aJoinerId_local;
  JoinerType aType_local;
  CommissionerApp *this_local;
  
  local_50.mType = aType;
  joinerInfo._M_node = (_Base_ptr)aJoinerId;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_50.mId,aJoinerId);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
       ::find(&this->mJoiners,&local_50);
  JoinerKey::~JoinerKey(&local_50);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
       ::end(&this->mJoiners);
  bVar1 = std::operator!=(&local_30,local_68);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>
             ::operator->(&local_30);
    this_local = (CommissionerApp *)&ppVar2->second;
  }
  else {
    local_90.mType = aType;
    Commissioner::ComputeJoinerId(&local_90.mId,0);
    local_70 = (_Base_ptr)
               std::
               map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
               ::find(&this->mJoiners,&local_90);
    local_30._M_node = local_70;
    JoinerKey::~JoinerKey(&local_90);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo,_std::less<ot::commissioner::CommissionerApp::JoinerKey>,_std::allocator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>_>
         ::end(&this->mJoiners);
    bVar1 = std::operator!=(&local_30,&local_98);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_ot::commissioner::CommissionerApp::JoinerKey,_ot::commissioner::JoinerInfo>_>
               ::operator->(&local_30);
      this_local = (CommissionerApp *)&ppVar2->second;
    }
    else {
      this_local = (CommissionerApp *)0x0;
    }
  }
  return (JoinerInfo *)this_local;
}

Assistant:

const JoinerInfo *CommissionerApp::GetJoinerInfo(JoinerType aType, const ByteArray &aJoinerId)
{
    auto joinerInfo = mJoiners.find({aType, aJoinerId});
    if (joinerInfo != mJoiners.end())
    {
        return &joinerInfo->second;
    }
    joinerInfo = mJoiners.find({aType, Commissioner::ComputeJoinerId(0)});
    if (joinerInfo != mJoiners.end())
    {
        return &joinerInfo->second;
    }
    return nullptr;
}